

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexIncrWriter::PtexIncrWriter
          (PtexIncrWriter *this,char *path,FILE *fp,MeshType mt,DataType dt,int nchannels,
          int alphachan,int nfaces)

{
  uint uVar1;
  size_t sVar2;
  ostream *poVar3;
  string local_1e0;
  ulong local_1c0;
  stringstream str;
  ostream local_1a8 [376];
  
  local_1c0 = (ulong)(uint)nfaces;
  PtexWriterBase::PtexWriterBase
            (&this->super_PtexWriterBase,path,mt,dt,nchannels,alphachan,nfaces,false);
  (this->super_PtexWriterBase).super_PtexWriter._vptr_PtexWriter =
       (_func_int **)&PTR__PtexIncrWriter_0012acb8;
  this->_fp = fp;
  sVar2 = fread(&(this->super_PtexWriterBase)._header,0x40,1,(FILE *)fp);
  if ((sVar2 == 0) || ((this->super_PtexWriterBase)._header.magic != 0x78657450)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&str);
    poVar3 = std::operator<<(local_1a8,"Not a ptex file: ");
    std::operator<<(poVar3,path);
    std::__cxx11::stringbuf::str();
    PtexWriterBase::setError(&this->super_PtexWriterBase,&local_1e0);
  }
  else if (((((this->super_PtexWriterBase)._header.meshtype == mt) &&
            ((this->super_PtexWriterBase)._header.datatype == dt)) &&
           ((uint)(this->super_PtexWriterBase)._header.nchannels == nchannels)) &&
          (((this->super_PtexWriterBase)._header.alphachan == alphachan &&
           ((this->super_PtexWriterBase)._header.nfaces == (uint32_t)local_1c0)))) {
    (this->super_PtexWriterBase)._extheader.lmddatasize = 0;
    (this->super_PtexWriterBase)._extheader.editdatasize = 0;
    (this->super_PtexWriterBase)._extheader.ubordermode = 0;
    (this->super_PtexWriterBase)._extheader.pad = 0;
    (this->super_PtexWriterBase)._extheader.vbordermode = 0;
    (this->super_PtexWriterBase)._extheader.edgefiltermode = 0;
    (this->super_PtexWriterBase)._extheader.lmdheaderzipsize = 0;
    (this->super_PtexWriterBase)._extheader.lmdheadermemsize = 0;
    (this->super_PtexWriterBase)._extheader.editdatapos = 0;
    uVar1 = (this->super_PtexWriterBase)._header.extheadersize;
    sVar2 = 0x28;
    if (uVar1 < 0x28) {
      sVar2 = (size_t)uVar1;
    }
    sVar2 = fread(&(this->super_PtexWriterBase)._extheader,sVar2,1,(FILE *)fp);
    if (sVar2 != 0) {
      fseeko((FILE *)this->_fp,0,2);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&str);
    poVar3 = std::operator<<(local_1a8,"Error reading extended header: ");
    std::operator<<(poVar3,path);
    std::__cxx11::stringbuf::str();
    PtexWriterBase::setError(&this->super_PtexWriterBase,&local_1e0);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&str);
    poVar3 = std::operator<<(local_1a8,
                             "PtexWriter::edit error: header doesn\'t match existing file, ");
    std::operator<<(poVar3,"conversions not currently supported");
    std::__cxx11::stringbuf::str();
    PtexWriterBase::setError(&this->super_PtexWriterBase,&local_1e0);
  }
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  return;
}

Assistant:

PtexIncrWriter::PtexIncrWriter(const char* path, FILE* fp,
                               Ptex::MeshType mt, Ptex::DataType dt,
                               int nchannels, int alphachan, int nfaces)
    : PtexWriterBase(path, mt, dt, nchannels, alphachan, nfaces,
                     /* compress */ false),
      _fp(fp)
{
    // note: incremental saves are not compressed (see compress flag above)
    // to improve save time in the case where in incremental save is followed by
    // a full save (which ultimately it always should be).  With a compressed
    // incremental save, the data would be compressed twice and decompressed once
    // on every save vs. just compressing once.

    // make sure existing header matches
    if (!fread(&_header, HeaderSize, 1, fp) || _header.magic != Magic) {
        std::stringstream str;
        str << "Not a ptex file: " << path;
        setError(str.str());
        return;
    }

    bool headerMatch = (mt == _header.meshtype &&
                        dt == datatype() &&
                        nchannels == _header.nchannels &&
                        alphachan == int(_header.alphachan) &&
                        nfaces == int(_header.nfaces));
    if (!headerMatch) {
        std::stringstream str;
        str << "PtexWriter::edit error: header doesn't match existing file, "
            << "conversions not currently supported";
        setError(str.str());
        return;
    }

    // read extended header
    memset(&_extheader, 0, sizeof(_extheader));
    if (!fread(&_extheader, PtexUtils::min(uint32_t(ExtHeaderSize), _header.extheadersize), 1, fp)) {
        std::stringstream str;
        str << "Error reading extended header: " << path;
        setError(str.str());
        return;
    }

    // seek to end of file to append
    fseeko(_fp, 0, SEEK_END);
}